

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chash.c
# Opt level: O2

void cf_hash(cf_chash *h,void *m,size_t nm,uint8_t *out)

{
  cf_chash_ctx ctx;
  undefined1 local_190 [360];
  
  if (h != (cf_chash *)0x0) {
    (*h->init)(local_190);
    (*h->update)(local_190,m,nm);
    (*h->digest)(local_190,out);
    memset(local_190,0,0x168);
    return;
  }
  abort();
}

Assistant:

void cf_hash(const cf_chash *h, const void *m, size_t nm, uint8_t *out)
{
  cf_chash_ctx ctx;
  assert(h);
  h->init(&ctx);
  h->update(&ctx, m, nm);
  h->digest(&ctx, out);
  mem_clean(&ctx, sizeof ctx);
}